

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_CreateWithAlias_Test::TestBody(PKCS12Test_CreateWithAlias_Test *this)

{
  allocator<x509_st_*> *this_00;
  initializer_list<x509_st_*> __l;
  bool bVar1;
  int len;
  char *pcVar2;
  X509 *pXVar3;
  uchar *puVar4;
  pointer pkey;
  size_type sVar5;
  BIO *pBVar6;
  PKCS12 *__p;
  pointer p12_00;
  size_t extraout_RDX;
  char *in_R9;
  Span<const_unsigned_char> b;
  AssertHelper local_3b8;
  Message local_3b0;
  Span<const_unsigned_char> local_3a8;
  string_view local_398;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_358;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__7;
  uchar *parsed_alias;
  int alias_len;
  Message local_320;
  unsigned_long local_318;
  size_t local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_1;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  UniquePtr<X509> delete_cert;
  UniquePtr<EVP_PKEY> delete_key;
  AssertHelper local_2c0;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__6;
  stack_st_X509 *ca_certs;
  X509 *parsed_cert;
  EVP_PKEY *parsed_key;
  AssertHelper local_260;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<PKCS12> p12;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<BIO> bio;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> der;
  pointer local_188;
  pointer local_180;
  iterator local_178;
  size_type local_170;
  undefined1 local_168 [8];
  vector<x509_st_*,_std::allocator<x509_st_*>_> certs;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  int res;
  string alias;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> cert2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<X509> cert1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  PKCS12Test_CreateWithAlias_Test *this_local;
  
  MakeTestKey();
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x260,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    MakeTestCert((EVP_PKEY *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cert2,(internal *)local_88,(AssertionResult *)"cert1","false","true",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x262,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&cert2);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      MakeTestCert((EVP_PKEY *)&gtest_ar__2.message_);
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)((long)&alias.field_2 + 8),(internal *)local_d0,
                   (AssertionResult *)"cert2","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x264,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)(alias.field_2._M_local_buf + 8));
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"I\'m an alias",
                   (allocator<char> *)
                   ((long)&gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        pXVar3 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
        puVar4 = (uchar *)std::__cxx11::string::data();
        len = std::__cxx11::string::size();
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = X509_alias_set1(pXVar3,puVar4,len);
        local_13c = 1;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_138,"res","1",(int *)&gtest_ar.message_,&local_13c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x26a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_148);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_148);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (bVar1) {
          local_188 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_180 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_178 = &local_188;
          local_170 = 2;
          this_00 = (allocator<x509_st_*> *)
                    ((long)&der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<x509_st_*>::allocator(this_00);
          __l._M_len = local_170;
          __l._M_array = local_178;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                    ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_168,__l,this_00);
          std::allocator<x509_st_*>::~allocator
                    ((allocator<x509_st_*> *)
                     ((long)&der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__3.message_)
          ;
          pkey = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
          ;
          local_1b9 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &gtest_ar__3.message_,pkey,
                                         (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_168)
          ;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
          if (!bVar1) {
            testing::Message::Message(&local_1c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&bio,(internal *)local_1b8,
                       (AssertionResult *)"PKCS12CreateVector(&der, key.get(), certs)","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x26e,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper(&local_1d0);
            std::__cxx11::string::~string((string *)&bio);
            testing::Message::~Message(&local_1c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
          if (bVar1) {
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar__3.message_);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &gtest_ar__3.message_);
            pBVar6 = BIO_new_mem_buf(puVar4,(int)sVar5);
            std::unique_ptr<bio_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,
                       (pointer)pBVar6);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_208,
                       (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
            if (!bVar1) {
              testing::Message::Message(&local_210);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&p12,(internal *)local_208,(AssertionResult *)0x8a2d4f,"false",
                         "true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_218,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x271,pcVar2);
              testing::internal::AssertHelper::operator=(&local_218,&local_210);
              testing::internal::AssertHelper::~AssertHelper(&local_218);
              std::__cxx11::string::~string((string *)&p12);
              testing::Message::~Message(&local_210);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
            if (bVar1) {
              pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__4.message_);
              __p = d2i_PKCS12_bio(pBVar6,(PKCS12 **)0x0);
              std::unique_ptr<pkcs12_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<pkcs12_st,bssl::internal::Deleter> *)&gtest_ar__5.message_,
                         (pointer)__p);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<pkcs12_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_250,
                         (unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
              if (!bVar1) {
                testing::Message::Message(&local_258);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&parsed_key,(internal *)local_250,(AssertionResult *)0x868ac5,
                           "false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_260,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x273,pcVar2);
                testing::internal::AssertHelper::operator=(&local_260,&local_258);
                testing::internal::AssertHelper::~AssertHelper(&local_260);
                std::__cxx11::string::~string((string *)&parsed_key);
                testing::Message::~Message(&local_258);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
              if (bVar1) {
                parsed_cert = (X509 *)0x0;
                ca_certs = (stack_st_X509 *)0x0;
                gtest_ar__6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                p12_00 = std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__5.message_);
                local_2ac = PKCS12_parse(p12_00,"foo",(EVP_PKEY **)&parsed_cert,(X509 **)&ca_certs,
                                         (stack_st_X509 **)&gtest_ar__6.message_);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_2a8,&local_2ac,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2a8);
                if (!bVar1) {
                  testing::Message::Message(&local_2b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&delete_key,(internal *)local_2a8,
                             (AssertionResult *)
                             "PKCS12_parse(p12.get(), kPassword, &parsed_key, &parsed_cert, &ca_certs)"
                             ,"false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2c0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x279,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_2c0);
                  std::__cxx11::string::~string((string *)&delete_key);
                  testing::Message::~Message(&local_2b8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
                if (bVar1) {
                  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&delete_cert,
                             (pointer)parsed_cert);
                  std::unique_ptr<x509_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<x509_st,bssl::internal::Deleter> *)&delete_ca_certs,
                             (pointer)ca_certs);
                  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)
                             &gtest_ar_1.message_,
                             (pointer)gtest_ar__6.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
                  local_310 = sk_X509_num((stack_st_X509 *)
                                          gtest_ar__6.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
                  local_318 = 1;
                  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                            ((EqHelper *)local_308,"sk_X509_num(ca_certs)","1UL",&local_310,
                             &local_318);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_308);
                  if (!bVar1) {
                    testing::Message::Message(&local_320);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&stack0xfffffffffffffcd8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x27e,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&stack0xfffffffffffffcd8,&local_320);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&stack0xfffffffffffffcd8);
                    testing::Message::~Message(&local_320);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
                  if (bVar1) {
                    parsed_alias._4_4_ = 0;
                    pXVar3 = (X509 *)sk_X509_value((stack_st_X509 *)
                                                   gtest_ar__6.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                    gtest_ar__7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )X509_alias_get0(pXVar3,(int *)((long)&parsed_alias + 4));
                    testing::AssertionResult::AssertionResult<unsigned_char_const*>
                              ((AssertionResult *)local_348,(uchar **)&gtest_ar__7.message_,
                               (type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_348);
                    if (!bVar1) {
                      testing::Message::Message(&local_350);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar_2.message_,(internal *)local_348,
                                 (AssertionResult *)"parsed_alias","false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_358,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                                 ,0x283,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_358,&local_350);
                      testing::internal::AssertHelper::~AssertHelper(&local_358);
                      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                      testing::Message::~Message(&local_350);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
                    if (bVar1) {
                      bssl::Span<const_unsigned_char>::Span
                                (&local_3a8,
                                 (uchar *)gtest_ar__7.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,(long)parsed_alias._4_4_);
                      b.size_ = extraout_RDX;
                      b.data_ = (uchar *)local_3a8.size_;
                      local_398 = bssl::BytesAsStringView((bssl *)local_3a8.data_,b);
                      testing::internal::EqHelper::
                      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                ((EqHelper *)local_388,"alias",
                                 "bssl::BytesAsStringView(bssl::Span(parsed_alias, alias_len))",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&res,&local_398);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_388);
                      if (!bVar1) {
                        testing::Message::Message(&local_3b0);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_388);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3b8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                                   ,0x285,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
                        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                        testing::Message::~Message(&local_3b0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
                    }
                  }
                  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                             &gtest_ar_1.message_);
                  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&delete_ca_certs);
                  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&delete_cert);
                }
              }
              std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
            }
            std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__3.message_)
          ;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector
                    ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_168);
        }
        std::__cxx11::string::~string((string *)&res);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(PKCS12Test, CreateWithAlias) {
  bssl::UniquePtr<EVP_PKEY> key = MakeTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key.get());
  ASSERT_TRUE(cert2);

  std::string alias = "I'm an alias";
  int res = X509_alias_set1(
      cert1.get(), reinterpret_cast<const unsigned char *>(alias.data()),
      alias.size());
  ASSERT_EQ(res, 1);

  std::vector<X509 *> certs = {cert1.get(), cert2.get()};
  std::vector<uint8_t> der;
  ASSERT_TRUE(PKCS12CreateVector(&der, key.get(), certs));

  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(der.data(), der.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<PKCS12> p12(d2i_PKCS12_bio(bio.get(), nullptr));
  ASSERT_TRUE(p12);

  EVP_PKEY *parsed_key = nullptr;
  X509 *parsed_cert = nullptr;
  STACK_OF(X509) *ca_certs = nullptr;
  ASSERT_TRUE(
      PKCS12_parse(p12.get(), kPassword, &parsed_key, &parsed_cert, &ca_certs));

  bssl::UniquePtr<EVP_PKEY> delete_key(parsed_key);
  bssl::UniquePtr<X509> delete_cert(parsed_cert);
  bssl::UniquePtr<STACK_OF(X509)> delete_ca_certs(ca_certs);
  ASSERT_EQ(sk_X509_num(ca_certs), 1UL);

  int alias_len = 0;
  const unsigned char *parsed_alias =
      X509_alias_get0(sk_X509_value(ca_certs, 0), &alias_len);
  ASSERT_TRUE(parsed_alias);
  ASSERT_EQ(alias,
            bssl::BytesAsStringView(bssl::Span(parsed_alias, alias_len)));
}